

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundedQueue.h
# Opt level: O3

void __thiscall Gluco::bqueue<unsigned_int>::push(bqueue<unsigned_int> *this,uint x)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  uint64_t uVar5;
  int iVar6;
  
  this->expComputed = false;
  iVar2 = this->queuesize;
  if (iVar2 == this->maxsize) {
    iVar1 = this->last;
    lVar3 = (long)iVar1;
    if (iVar1 != this->first) {
      __assert_fail("last==first",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/BoundedQueue.h"
                    ,0x34,"void Gluco::bqueue<unsigned int>::push(T) [T = unsigned int]");
    }
    puVar4 = (this->elems).data;
    uVar5 = this->sumofqueue - (ulong)puVar4[lVar3];
    iVar6 = 0;
    if (iVar1 + 1 != iVar2) {
      iVar6 = iVar1 + 1;
    }
    this->last = iVar6;
  }
  else {
    this->queuesize = iVar2 + 1;
    puVar4 = (this->elems).data;
    uVar5 = this->sumofqueue;
    lVar3 = (long)this->first;
  }
  this->sumofqueue = x + uVar5;
  puVar4[lVar3] = x;
  iVar2 = this->first + 1;
  this->first = iVar2;
  if (iVar2 == this->maxsize) {
    this->first = 0;
    this->last = 0;
  }
  return;
}

Assistant:

void push(T x) {
      expComputed = false;
        if (queuesize==maxsize) {
            assert(last==first); // The queue is full, next value to enter will replace oldest one
            sumofqueue -= elems[last];
            if ((++last) == maxsize) last = 0;
        } else 
            queuesize++;
        sumofqueue += x;
        elems[first] = x;
        if ((++first) == maxsize) {first = 0;last = 0;}
    }